

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TDeletingArray<FListMenuItem_*,_FListMenuItem_*>::~TDeletingArray
          (TDeletingArray<FListMenuItem_*,_FListMenuItem_*> *this)

{
  FListMenuItem *pFVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->super_TArray<FListMenuItem_*,_FListMenuItem_*>).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pFVar1 = (this->super_TArray<FListMenuItem_*,_FListMenuItem_*>).Array[uVar3];
      if (pFVar1 != (FListMenuItem *)0x0) {
        (*pFVar1->_vptr_FListMenuItem[1])();
        uVar2 = (this->super_TArray<FListMenuItem_*,_FListMenuItem_*>).Count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  TArray<FListMenuItem_*,_FListMenuItem_*>::~TArray
            (&this->super_TArray<FListMenuItem_*,_FListMenuItem_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}